

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::BitfieldReverseCase::getInputValues
          (BitfieldReverseCase *this,int numValues,void **values)

{
  deUint32 dVar1;
  DataType dataType;
  Precision precision_00;
  char *str;
  const_reference pvVar2;
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *this_00;
  deUint32 *inValue;
  Precision precision;
  DataType type;
  Random rnd;
  void **values_local;
  int numValues_local;
  BitfieldReverseCase *this_local;
  
  rnd.m_rnd._8_8_ = values;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar1 = deStringHash(str);
  de::Random::Random((Random *)&precision,dVar1 ^ 0xff23a4);
  this_00 = &(this->super_IntegerFunctionCase).m_spec.inputs;
  pvVar2 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](this_00,0);
  dataType = glu::VarType::getBasicType(&pvVar2->varType);
  pvVar2 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](this_00,0);
  precision_00 = glu::VarType::getPrecision(&pvVar2->varType);
  anon_unknown_3::generateRandomInputData
            ((Random *)&precision,(this->super_IntegerFunctionCase).m_shaderType,dataType,
             precision_00,*(deUint32 **)rnd.m_rnd._8_8_,numValues);
  de::Random::~Random((Random *)&precision);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		de::Random				rnd			(deStringHash(getName()) ^ 0xff23a4);
		const glu::DataType		type		= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision	= m_spec.inputs[0].varType.getPrecision();
		deUint32*				inValue		= (deUint32*)values[0];

		generateRandomInputData(rnd, m_shaderType, type, precision, inValue, numValues);
	}